

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

ConvexH * ConvexDecomposition::ConvexHMakeCube(float3 *bmin,float3 *bmax)

{
  float fVar1;
  float fVar2;
  float3 *pfVar3;
  Plane *pPVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ConvexH *pCVar7;
  char *__function;
  undefined1 auVar8 [16];
  
  pCVar7 = test_cube();
  if (0 < (pCVar7->vertices).count) {
    fVar1 = bmin->z;
    fVar2 = bmin->y;
    pfVar3 = (pCVar7->vertices).element;
    pfVar3->x = bmin->x;
    pfVar3->y = fVar2;
    pfVar3->z = fVar1;
    if (1 < (pCVar7->vertices).count) {
      fVar1 = bmax->z;
      fVar2 = bmin->y;
      pfVar3[1].x = bmin->x;
      pfVar3[1].y = fVar2;
      pfVar3[1].z = fVar1;
      if (2 < (pCVar7->vertices).count) {
        fVar1 = bmin->z;
        fVar2 = bmax->y;
        pfVar3[2].x = bmin->x;
        pfVar3[2].y = fVar2;
        pfVar3[2].z = fVar1;
        if (3 < (pCVar7->vertices).count) {
          fVar1 = bmax->y;
          fVar2 = bmax->z;
          pfVar3[3].x = bmin->x;
          pfVar3[3].y = fVar1;
          pfVar3[3].z = fVar2;
          if (4 < (pCVar7->vertices).count) {
            fVar1 = bmin->y;
            fVar2 = bmin->z;
            pfVar3[4].x = bmax->x;
            pfVar3[4].y = fVar1;
            pfVar3[4].z = fVar2;
            if (5 < (pCVar7->vertices).count) {
              fVar1 = bmax->z;
              fVar2 = bmin->y;
              pfVar3[5].x = bmax->x;
              pfVar3[5].y = fVar2;
              pfVar3[5].z = fVar1;
              if (6 < (pCVar7->vertices).count) {
                fVar1 = bmin->z;
                fVar2 = bmax->y;
                pfVar3[6].x = bmax->x;
                pfVar3[6].y = fVar2;
                pfVar3[6].z = fVar1;
                if (7 < (pCVar7->vertices).count) {
                  fVar1 = bmax->z;
                  fVar2 = bmax->y;
                  pfVar3[7].x = bmax->x;
                  pfVar3[7].y = fVar2;
                  pfVar3[7].z = fVar1;
                  if (0 < (pCVar7->facets).count) {
                    fVar1 = bmin->x;
                    pPVar4 = (pCVar7->facets).element;
                    (pPVar4->normal).x = -1.0;
                    (pPVar4->normal).y = 0.0;
                    (pPVar4->normal).z = 0.0;
                    pPVar4->dist = fVar1;
                    if (1 < (pCVar7->facets).count) {
                      auVar8._8_4_ = 0x80000000;
                      auVar8._0_8_ = 0x8000000080000000;
                      auVar8._12_4_ = 0x80000000;
                      auVar8 = vxorps_avx512vl(ZEXT416((uint)bmax->x),auVar8);
                      pPVar4[1].normal.x = 1.0;
                      pPVar4[1].normal.y = 0.0;
                      pPVar4[1].normal.z = 0.0;
                      pPVar4[1].dist = auVar8._0_4_;
                      if (2 < (pCVar7->facets).count) {
                        fVar1 = bmin->y;
                        pPVar4[2].normal.x = 0.0;
                        pPVar4[2].normal.y = -1.0;
                        pPVar4[2].normal.z = 0.0;
                        pPVar4[2].dist = fVar1;
                        if (3 < (pCVar7->facets).count) {
                          auVar5._8_4_ = 0x80000000;
                          auVar5._0_8_ = 0x8000000080000000;
                          auVar5._12_4_ = 0x80000000;
                          auVar8 = vxorps_avx512vl(ZEXT416((uint)bmax->y),auVar5);
                          pPVar4[3].normal.x = 0.0;
                          pPVar4[3].normal.y = 1.0;
                          pPVar4[3].normal.z = 0.0;
                          pPVar4[3].dist = auVar8._0_4_;
                          if (4 < (pCVar7->facets).count) {
                            fVar1 = bmin->z;
                            pPVar4[4].normal.x = 0.0;
                            pPVar4[4].normal.y = 0.0;
                            pPVar4[4].normal.z = -1.0;
                            pPVar4[4].dist = fVar1;
                            if (5 < (pCVar7->facets).count) {
                              auVar6._8_4_ = 0x80000000;
                              auVar6._0_8_ = 0x8000000080000000;
                              auVar6._12_4_ = 0x80000000;
                              auVar8 = vxorps_avx512vl(ZEXT416((uint)bmax->z),auVar6);
                              pPVar4[5].normal.x = 0.0;
                              pPVar4[5].normal.y = 0.0;
                              pPVar4[5].normal.z = 1.0;
                              pPVar4[5].dist = auVar8._0_4_;
                              return pCVar7;
                            }
                          }
                        }
                      }
                    }
                  }
                  __function = 
                  "Type &ConvexDecomposition::Array<ConvexDecomposition::Plane>::operator[](int) [Type = ConvexDecomposition::Plane]"
                  ;
                  goto LAB_0092f8df;
                }
              }
            }
          }
        }
      }
    }
  }
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::operator[](int) [Type = ConvexDecomposition::float3]"
  ;
LAB_0092f8df:
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,__function);
}

Assistant:

ConvexH *ConvexHMakeCube(const REAL3 &bmin, const REAL3 &bmax) {
	ConvexH *convex = test_cube();
	convex->vertices[0] = REAL3(bmin.x,bmin.y,bmin.z);
	convex->vertices[1] = REAL3(bmin.x,bmin.y,bmax.z);
	convex->vertices[2] = REAL3(bmin.x,bmax.y,bmin.z);
	convex->vertices[3] = REAL3(bmin.x,bmax.y,bmax.z);
	convex->vertices[4] = REAL3(bmax.x,bmin.y,bmin.z);
	convex->vertices[5] = REAL3(bmax.x,bmin.y,bmax.z);
	convex->vertices[6] = REAL3(bmax.x,bmax.y,bmin.z);
	convex->vertices[7] = REAL3(bmax.x,bmax.y,bmax.z);

	convex->facets[0] = Plane(REAL3(-1,0,0), bmin.x);
	convex->facets[1] = Plane(REAL3(1,0,0), -bmax.x);
	convex->facets[2] = Plane(REAL3(0,-1,0), bmin.y);
	convex->facets[3] = Plane(REAL3(0,1,0), -bmax.y);
	convex->facets[4] = Plane(REAL3(0,0,-1), bmin.z);
	convex->facets[5] = Plane(REAL3(0,0,1), -bmax.z);
	return convex;
}